

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * mksymname(lua_State *L,char *modname,char *prefix)

{
  char *pcVar1;
  char *mark;
  char *funcname;
  char *prefix_local;
  char *modname_local;
  lua_State *L_local;
  
  pcVar1 = strchr(modname,0x2d);
  prefix_local = modname;
  if (pcVar1 != (char *)0x0) {
    prefix_local = pcVar1 + 1;
  }
  pcVar1 = luaL_gsub(L,prefix_local,".","_");
  pcVar1 = lua_pushfstring(L,prefix,pcVar1);
  lua_remove(L,-2);
  return pcVar1;
}

Assistant:

static const char *mksymname(lua_State *L, const char *modname,
			     const char *prefix)
{
  const char *funcname;
  const char *mark = strchr(modname, *LUA_IGMARK);
  if (mark) modname = mark + 1;
  funcname = luaL_gsub(L, modname, ".", "_");
  funcname = lua_pushfstring(L, prefix, funcname);
  lua_remove(L, -2);  /* remove 'gsub' result */
  return funcname;
}